

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_processing_sse2.c
# Opt level: O2

void ExtractGreen_SSE2(uint32_t *argb,uint8_t *alpha,int size)

{
  uint *puVar1;
  uint8_t *puVar2;
  uint *puVar3;
  uint *puVar4;
  uint *puVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  ulong uVar22;
  __m128i *src;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  
  auVar25 = _DAT_001a8f90;
  uVar22 = 0;
  while ((long)(uVar22 + 0x10) <= (long)size) {
    puVar1 = argb + uVar22;
    puVar3 = argb + uVar22 + 4;
    puVar4 = argb + uVar22 + 8;
    puVar5 = argb + uVar22 + 0xc;
    auVar23._0_4_ = *puVar1 >> 8;
    auVar23._4_4_ = puVar1[1] >> 8;
    auVar23._8_4_ = puVar1[2] >> 8;
    auVar23._12_4_ = puVar1[3] >> 8;
    auVar26._0_4_ = *puVar3 >> 8;
    auVar26._4_4_ = puVar3[1] >> 8;
    auVar26._8_4_ = puVar3[2] >> 8;
    auVar26._12_4_ = puVar3[3] >> 8;
    auVar27._0_4_ = *puVar4 >> 8;
    auVar27._4_4_ = puVar4[1] >> 8;
    auVar27._8_4_ = puVar4[2] >> 8;
    auVar27._12_4_ = puVar4[3] >> 8;
    auVar29._0_4_ = *puVar5 >> 8;
    auVar29._4_4_ = puVar5[1] >> 8;
    auVar29._8_4_ = puVar5[2] >> 8;
    auVar29._12_4_ = puVar5[3] >> 8;
    auVar24 = packssdw(auVar23 & auVar25,auVar26 & auVar25);
    auVar28 = packssdw(auVar27 & auVar25,auVar29 & auVar25);
    sVar6 = auVar24._0_2_;
    sVar7 = auVar24._2_2_;
    sVar8 = auVar24._4_2_;
    sVar9 = auVar24._6_2_;
    sVar10 = auVar24._8_2_;
    sVar11 = auVar24._10_2_;
    sVar12 = auVar24._12_2_;
    sVar13 = auVar24._14_2_;
    sVar14 = auVar28._0_2_;
    sVar15 = auVar28._2_2_;
    sVar16 = auVar28._4_2_;
    sVar17 = auVar28._6_2_;
    sVar18 = auVar28._8_2_;
    sVar19 = auVar28._10_2_;
    sVar20 = auVar28._12_2_;
    sVar21 = auVar28._14_2_;
    puVar2 = alpha + uVar22;
    *puVar2 = (0 < sVar6) * (sVar6 < 0x100) * auVar24[0] - (0xff < sVar6);
    puVar2[1] = (0 < sVar7) * (sVar7 < 0x100) * auVar24[2] - (0xff < sVar7);
    puVar2[2] = (0 < sVar8) * (sVar8 < 0x100) * auVar24[4] - (0xff < sVar8);
    puVar2[3] = (0 < sVar9) * (sVar9 < 0x100) * auVar24[6] - (0xff < sVar9);
    puVar2[4] = (0 < sVar10) * (sVar10 < 0x100) * auVar24[8] - (0xff < sVar10);
    puVar2[5] = (0 < sVar11) * (sVar11 < 0x100) * auVar24[10] - (0xff < sVar11);
    puVar2[6] = (0 < sVar12) * (sVar12 < 0x100) * auVar24[0xc] - (0xff < sVar12);
    puVar2[7] = (0 < sVar13) * (sVar13 < 0x100) * auVar24[0xe] - (0xff < sVar13);
    puVar2[8] = (0 < sVar14) * (sVar14 < 0x100) * auVar28[0] - (0xff < sVar14);
    puVar2[9] = (0 < sVar15) * (sVar15 < 0x100) * auVar28[2] - (0xff < sVar15);
    puVar2[10] = (0 < sVar16) * (sVar16 < 0x100) * auVar28[4] - (0xff < sVar16);
    puVar2[0xb] = (0 < sVar17) * (sVar17 < 0x100) * auVar28[6] - (0xff < sVar17);
    puVar2[0xc] = (0 < sVar18) * (sVar18 < 0x100) * auVar28[8] - (0xff < sVar18);
    puVar2[0xd] = (0 < sVar19) * (sVar19 < 0x100) * auVar28[10] - (0xff < sVar19);
    puVar2[0xe] = (0 < sVar20) * (sVar20 < 0x100) * auVar28[0xc] - (0xff < sVar20);
    puVar2[0xf] = (0 < sVar21) * (sVar21 < 0x100) * auVar28[0xe] - (0xff < sVar21);
    uVar22 = uVar22 + 0x10;
  }
  if ((int)(uVar22 + 8) <= size) {
    puVar1 = argb + uVar22;
    puVar3 = argb + uVar22 + 4;
    auVar24._0_4_ = *puVar1 >> 8;
    auVar24._4_4_ = puVar1[1] >> 8;
    auVar24._8_4_ = puVar1[2] >> 8;
    auVar24._12_4_ = puVar1[3] >> 8;
    auVar28._0_4_ = *puVar3 >> 8;
    auVar28._4_4_ = puVar3[1] >> 8;
    auVar28._8_4_ = puVar3[2] >> 8;
    auVar28._12_4_ = puVar3[3] >> 8;
    auVar25 = packssdw(auVar24 & auVar25,auVar28 & auVar25);
    sVar6 = auVar25._0_2_;
    sVar7 = auVar25._2_2_;
    sVar8 = auVar25._4_2_;
    sVar9 = auVar25._6_2_;
    sVar10 = auVar25._8_2_;
    sVar11 = auVar25._10_2_;
    sVar12 = auVar25._12_2_;
    sVar13 = auVar25._14_2_;
    *(ulong *)(alpha + uVar22) =
         CONCAT17((0 < sVar13) * (sVar13 < 0x100) * auVar25[0xe] - (0xff < sVar13),
                  CONCAT16((0 < sVar12) * (sVar12 < 0x100) * auVar25[0xc] - (0xff < sVar12),
                           CONCAT15((0 < sVar11) * (sVar11 < 0x100) * auVar25[10] - (0xff < sVar11),
                                    CONCAT14((0 < sVar10) * (sVar10 < 0x100) * auVar25[8] -
                                             (0xff < sVar10),
                                             CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar25[6] -
                                                      (0xff < sVar9),
                                                      CONCAT12((0 < sVar8) * (sVar8 < 0x100) *
                                                               auVar25[4] - (0xff < sVar8),
                                                               CONCAT11((0 < sVar7) *
                                                                        (sVar7 < 0x100) * auVar25[2]
                                                                        - (0xff < sVar7),
                                                                        (0 < sVar6) *
                                                                        (sVar6 < 0x100) * auVar25[0]
                                                                        - (0xff < sVar6))))))));
    uVar22 = uVar22 + 8 & 0xffffffff;
  }
  for (uVar22 = uVar22 & 0xffffffff; (long)uVar22 < (long)size; uVar22 = uVar22 + 1) {
    alpha[uVar22] = *(uint8_t *)((long)argb + uVar22 * 4 + 1);
  }
  return;
}

Assistant:

static void ExtractGreen_SSE2(const uint32_t* WEBP_RESTRICT argb,
                              uint8_t* WEBP_RESTRICT alpha, int size) {
  int i;
  const __m128i mask = _mm_set1_epi32(0xff);
  const __m128i* src = (const __m128i*)argb;

  for (i = 0; i + 16 <= size; i += 16, src += 4) {
    const __m128i a0 = _mm_loadu_si128(src + 0);
    const __m128i a1 = _mm_loadu_si128(src + 1);
    const __m128i a2 = _mm_loadu_si128(src + 2);
    const __m128i a3 = _mm_loadu_si128(src + 3);
    const __m128i b0 = _mm_srli_epi32(a0, 8);
    const __m128i b1 = _mm_srli_epi32(a1, 8);
    const __m128i b2 = _mm_srli_epi32(a2, 8);
    const __m128i b3 = _mm_srli_epi32(a3, 8);
    const __m128i c0 = _mm_and_si128(b0, mask);
    const __m128i c1 = _mm_and_si128(b1, mask);
    const __m128i c2 = _mm_and_si128(b2, mask);
    const __m128i c3 = _mm_and_si128(b3, mask);
    const __m128i d0 = _mm_packs_epi32(c0, c1);
    const __m128i d1 = _mm_packs_epi32(c2, c3);
    const __m128i e = _mm_packus_epi16(d0, d1);
    // store
    _mm_storeu_si128((__m128i*)&alpha[i], e);
  }
  if (i + 8 <= size) {
    const __m128i a0 = _mm_loadu_si128(src + 0);
    const __m128i a1 = _mm_loadu_si128(src + 1);
    const __m128i b0 = _mm_srli_epi32(a0, 8);
    const __m128i b1 = _mm_srli_epi32(a1, 8);
    const __m128i c0 = _mm_and_si128(b0, mask);
    const __m128i c1 = _mm_and_si128(b1, mask);
    const __m128i d = _mm_packs_epi32(c0, c1);
    const __m128i e = _mm_packus_epi16(d, d);
    _mm_storel_epi64((__m128i*)&alpha[i], e);
    i += 8;
  }
  for (; i < size; ++i) alpha[i] = argb[i] >> 8;
}